

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

NESTresult * __thiscall
NEST::NESTcalc::FullCalculation
          (NESTresult *__return_storage_ptr__,NESTcalc *this,INTERACTION_TYPE species,double energy,
          double density,double dfield,double A,double Z,
          vector<double,_std::allocator<double>_> *NRYieldsParam,
          vector<double,_std::allocator<double>_> *NRERWidthsParam,
          vector<double,_std::allocator<double>_> *ERYieldsParam,bool do_times)

{
  allocator_type local_79;
  double local_78;
  double local_70;
  double local_68;
  YieldResult local_60;
  value_type local_30;
  
  if (density < 1.0) {
    this->fdetector->inGas = true;
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = energy;
  local_70 = dfield;
  local_68 = density;
  GetYields(&local_60,this,species,energy,density,dfield,A,Z,NRYieldsParam,ERYieldsParam);
  *(undefined4 *)&(__return_storage_ptr__->yields).ElectricField = local_60.ElectricField._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->yields).ElectricField + 4) =
       local_60.ElectricField._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->yields).DeltaT_Scint = local_60.DeltaT_Scint._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->yields).DeltaT_Scint + 4) =
       local_60.DeltaT_Scint._4_4_;
  (__return_storage_ptr__->yields).ExcitonRatio = local_60.ExcitonRatio;
  (__return_storage_ptr__->yields).Lindhard = local_60.Lindhard;
  (__return_storage_ptr__->yields).PhotonYield = local_60.PhotonYield;
  (__return_storage_ptr__->yields).ElectronYield = local_60.ElectronYield;
  (*this->_vptr_NESTcalc[0xc])
            (SUB84(local_68,0),0,&local_60,this,__return_storage_ptr__,NRERWidthsParam);
  (__return_storage_ptr__->quanta).recombProb = local_60.ExcitonRatio;
  (__return_storage_ptr__->quanta).Variance = local_60.Lindhard;
  *(double *)&__return_storage_ptr__->quanta = local_60.PhotonYield;
  *(double *)&(__return_storage_ptr__->quanta).ions = local_60.ElectronYield;
  if (do_times) {
    GetPhotonTimes((photonstream *)&local_60,this,species,(__return_storage_ptr__->quanta).photons,
                   (__return_storage_ptr__->quanta).excitons,local_70,local_78);
  }
  else {
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_60,
               (long)(__return_storage_ptr__->quanta).photons,&local_30,&local_79);
  }
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&__return_storage_ptr__->photon_times,&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

NESTresult NESTcalc::FullCalculation(INTERACTION_TYPE species, double energy,
                                     double density, double dfield, double A,
                                     double Z,
                                     const std::vector<double> &NRYieldsParam,
                                     const std::vector<double> &NRERWidthsParam,
                                     const std::vector<double> &ERYieldsParam,
                                     bool do_times /*=true*/) {
  if (density < 1.) fdetector->set_inGas(true);
  NESTresult result;
  result.yields = GetYields(species, energy, density, dfield, A, Z,
                            NRYieldsParam, ERYieldsParam);
  result.quanta =
      GetQuanta(result.yields, density, NRERWidthsParam, -999.);
  if (do_times)
    result.photon_times = GetPhotonTimes(
        species, result.quanta.photons, result.quanta.excitons, dfield, energy);
  else {
    result.photon_times = photonstream(result.quanta.photons, 0.0);
  }
  return result;
}